

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprSkipCollate(Expr *pExpr)

{
  ExprList_item *pEVar1;
  
  while ((pExpr != (Expr *)0x0 && ((pExpr->flags >> 0xc & 1) != 0))) {
    if ((pExpr->flags >> 0x12 & 1) == 0) {
      pEVar1 = (ExprList_item *)&pExpr->pLeft;
    }
    else {
      pEVar1 = ((pExpr->x).pList)->a;
    }
    pExpr = pEVar1->pExpr;
  }
  return pExpr;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSkipCollate(Expr *pExpr){
  while( pExpr && ExprHasProperty(pExpr, EP_Skip) ){
    if( ExprHasProperty(pExpr, EP_Unlikely) ){
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      assert( pExpr->x.pList->nExpr>0 );
      assert( pExpr->op==TK_FUNCTION );
      pExpr = pExpr->x.pList->a[0].pExpr;
    }else{
      assert( pExpr->op==TK_COLLATE );
      pExpr = pExpr->pLeft;
    }
  }   
  return pExpr;
}